

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O2

bool __thiscall
QNativeSocketEnginePrivate::fetchConnectionParameters(QNativeSocketEnginePrivate *this)

{
  QHostAddress *this_00;
  QHostAddress *this_01;
  bool bVar1;
  int iVar2;
  NetworkLayerProtocol NVar3;
  int *piVar4;
  SocketType SVar5;
  long in_FS_OFFSET;
  socklen_t valueSize;
  int value;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  char *local_60;
  socklen_t optlen;
  int ipv6only;
  socklen_t sockAddrSize;
  qt_sockaddr local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QAbstractSocketEnginePrivate).localPort = 0;
  this_00 = &(this->super_QAbstractSocketEnginePrivate).localAddress;
  QHostAddress::clear(this_00);
  (this->super_QAbstractSocketEnginePrivate).peerPort = 0;
  this_01 = &(this->super_QAbstractSocketEnginePrivate).peerAddress;
  QHostAddress::clear(this_01);
  (this->super_QAbstractSocketEnginePrivate).inboundStreamCount = 0;
  (this->super_QAbstractSocketEnginePrivate).outboundStreamCount = 0;
  if (this->socketDescriptor == -1) {
LAB_00217ad0:
    bVar1 = false;
  }
  else {
    sockAddrSize = 0x1c;
    local_48._0_8_ = 0;
    local_48._8_4_ = 0;
    local_48._12_4_ = 0;
    local_48._16_4_ = 0;
    local_48._20_8_ = 0;
    iVar2 = getsockname((int)this->socketDescriptor,(sockaddr *)&local_48.a,&sockAddrSize);
    if (iVar2 == 0) {
      qt_socket_getPortAndAddress
                (&local_48,&(this->super_QAbstractSocketEnginePrivate).localPort,this_00);
      if (local_48.a.sa_family == 2) {
        NVar3 = IPv4Protocol;
      }
      else {
        if (local_48.a.sa_family == 10) {
          (this->super_QAbstractSocketEnginePrivate).socketProtocol = IPv6Protocol;
          goto LAB_00217b3a;
        }
        NVar3 = UnknownNetworkLayerProtocol;
      }
      (this->super_QAbstractSocketEnginePrivate).socketProtocol = NVar3;
      ipv6only = 0;
      optlen = 4;
    }
    else {
      piVar4 = __errno_location();
      if (*piVar4 == 9) {
        setError(this,UnsupportedSocketOperationError,InvalidSocketErrorString);
        goto LAB_00217ad0;
      }
      ipv6only = 0;
      optlen = 4;
      if ((this->super_QAbstractSocketEnginePrivate).socketProtocol == IPv6Protocol) {
LAB_00217b3a:
        ipv6only = 0;
        optlen = 4;
        bVar1 = QHostAddress::operator==(this_00,AnyIPv4);
        if (!bVar1) {
          bVar1 = QHostAddress::operator==(this_00,AnyIPv6);
          if (!bVar1) goto LAB_00217bba;
        }
        iVar2 = getsockopt((int)this->socketDescriptor,0x29,0x1a,&ipv6only,&optlen);
        if (iVar2 == 0) {
          if (optlen != 4) {
            value = 2;
            local_64 = 0;
            local_74 = 0;
            uStack_6c = 0;
            local_60 = "default";
            QMessageLogger::warning((char *)&value,"unexpected size of IPV6_V6ONLY socket option");
          }
          if (ipv6only == 0) {
            (this->super_QAbstractSocketEnginePrivate).socketProtocol = AnyIPProtocol;
            QHostAddress::operator=(this_00,Any);
          }
        }
      }
    }
LAB_00217bba:
    iVar2 = getpeername((int)this->socketDescriptor,(sockaddr *)&local_48.a,&sockAddrSize);
    if (iVar2 == 0) {
      qt_socket_getPortAndAddress
                (&local_48,&(this->super_QAbstractSocketEnginePrivate).peerPort,this_01);
      (this->super_QAbstractSocketEnginePrivate).inboundStreamCount = 1;
      (this->super_QAbstractSocketEnginePrivate).outboundStreamCount = 1;
    }
    value = 0;
    valueSize = 4;
    iVar2 = getsockopt((int)this->socketDescriptor,1,3,&value,&valueSize);
    if (iVar2 == 0) {
      SVar5 = TcpSocket;
      if (value != 1) {
        SVar5 = (uint)(value == 2) * 2 + UnknownSocketType;
      }
      (this->super_QAbstractSocketEnginePrivate).socketType = SVar5;
    }
    bVar1 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::fetchConnectionParameters()
{
    localPort = 0;
    localAddress.clear();
    peerPort = 0;
    peerAddress.clear();
    inboundStreamCount = outboundStreamCount = 0;

    if (socketDescriptor == -1)
        return false;

    qt_sockaddr sa;
    QT_SOCKLEN_T sockAddrSize = sizeof(sa);

    // Determine local address
    memset(&sa, 0, sizeof(sa));
    if (::getsockname(socketDescriptor, &sa.a, &sockAddrSize) == 0) {
        qt_socket_getPortAndAddress(&sa, &localPort, &localAddress);

        // Determine protocol family
        switch (sa.a.sa_family) {
        case AF_INET:
            socketProtocol = QAbstractSocket::IPv4Protocol;
            break;
        case AF_INET6:
            socketProtocol = QAbstractSocket::IPv6Protocol;
            break;
        default:
            socketProtocol = QAbstractSocket::UnknownNetworkLayerProtocol;
            break;
        }

    } else if (errno == EBADF) {
        setError(QAbstractSocket::UnsupportedSocketOperationError, InvalidSocketErrorString);
        return false;
    }

#if defined (IPV6_V6ONLY)
    // determine if local address is dual mode
    // On linux, these are returned as "::" (==AnyIPv6)
    // On OSX, these are returned as "::FFFF:0.0.0.0" (==AnyIPv4)
    // in either case, the IPV6_V6ONLY option is cleared
    int ipv6only = 0;
    socklen_t optlen = sizeof(ipv6only);
    if (socketProtocol == QAbstractSocket::IPv6Protocol
        && (localAddress == QHostAddress::AnyIPv4 || localAddress == QHostAddress::AnyIPv6)
        && !getsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_V6ONLY, (char*)&ipv6only, &optlen )) {
            if (optlen != sizeof(ipv6only))
                qWarning("unexpected size of IPV6_V6ONLY socket option");
            if (!ipv6only) {
                socketProtocol = QAbstractSocket::AnyIPProtocol;
                localAddress = QHostAddress::Any;
            }
    }
#endif

    // Determine the remote address
    bool connected = ::getpeername(socketDescriptor, &sa.a, &sockAddrSize) == 0;
    if (connected) {
        qt_socket_getPortAndAddress(&sa, &peerPort, &peerAddress);
        inboundStreamCount = outboundStreamCount = 1;
    }

    // Determine the socket type (UDP/TCP/SCTP)
    int value = 0;
    QT_SOCKOPTLEN_T valueSize = sizeof(int);
    if (::getsockopt(socketDescriptor, SOL_SOCKET, SO_TYPE, &value, &valueSize) == 0) {
        if (value == SOCK_STREAM) {
#ifndef QT_NO_SCTP
            if (option(QNativeSocketEngine::MaxStreamsSocketOption) != -1) {
                socketType = QAbstractSocket::SctpSocket;
                if (connected) {
                    sctp_status sctpStatus;
                    QT_SOCKOPTLEN_T sctpStatusSize = sizeof(sctpStatus);
                    sctp_event_subscribe sctpEvents;

                    memset(&sctpEvents, 0, sizeof(sctpEvents));
                    sctpEvents.sctp_data_io_event = 1;
                    if (::getsockopt(socketDescriptor, SOL_SCTP, SCTP_STATUS, &sctpStatus,
                                     &sctpStatusSize) == 0 &&
                        ::setsockopt(socketDescriptor, SOL_SCTP, SCTP_EVENTS, &sctpEvents,
                                     sizeof(sctpEvents)) == 0) {
                        inboundStreamCount = int(sctpStatus.sstat_instrms);
                        outboundStreamCount = int(sctpStatus.sstat_outstrms);
                    } else {
                        setError(QAbstractSocket::UnsupportedSocketOperationError,
                                 InvalidSocketErrorString);
                        return false;
                    }
                }
            } else {
                socketType = QAbstractSocket::TcpSocket;
            }
#else
                socketType = QAbstractSocket::TcpSocket;
#endif
        } else {
            if (value == SOCK_DGRAM)
                socketType = QAbstractSocket::UdpSocket;
            else
                socketType = QAbstractSocket::UnknownSocketType;
        }
    }
#if defined (QNATIVESOCKETENGINE_DEBUG)
    QString socketProtocolStr = QStringLiteral("UnknownProtocol");
    if (socketProtocol == QAbstractSocket::IPv4Protocol) socketProtocolStr = QStringLiteral("IPv4Protocol");
    else if (socketProtocol == QAbstractSocket::IPv6Protocol || socketProtocol == QAbstractSocket::AnyIPProtocol) socketProtocolStr = QStringLiteral("IPv6Protocol");

    QString socketTypeStr = QStringLiteral("UnknownSocketType");
    if (socketType == QAbstractSocket::TcpSocket) socketTypeStr = QStringLiteral("TcpSocket");
    else if (socketType == QAbstractSocket::UdpSocket) socketTypeStr = QStringLiteral("UdpSocket");
    else if (socketType == QAbstractSocket::SctpSocket) socketTypeStr = QStringLiteral("SctpSocket");

    qDebug("QNativeSocketEnginePrivate::fetchConnectionParameters() local == %s:%i,"
           " peer == %s:%i, socket == %s - %s, inboundStreamCount == %i, outboundStreamCount == %i",
           localAddress.toString().toLatin1().constData(), localPort,
           peerAddress.toString().toLatin1().constData(), peerPort,socketTypeStr.toLatin1().constData(),
           socketProtocolStr.toLatin1().constData(), inboundStreamCount, outboundStreamCount);
#endif
    return true;
}